

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fepoll.cpp
# Opt level: O0

int __thiscall fepoll::del_event(fepoll *this,iobject *object,socket_t fd,int events)

{
  uint uVar1;
  undefined1 local_40 [4];
  int ret;
  epoll_event event;
  int op;
  int newevs;
  int exists;
  int events_local;
  socket_t fd_local;
  iobject *object_local;
  fepoll *this_local;
  
  uVar1 = iobject::get_events(object);
  local_40 = (undefined1  [4])(uVar1 & (events ^ 0xffffffffU));
  event.data.fd = 3;
  if (local_40 == (undefined1  [4])0x0) {
    event.data.fd = 2;
  }
  _ret = object;
  event.data.u64._4_4_ = local_40;
  this_local._4_4_ = epoll_ctl(this->epfd_,event.data.fd,fd,(epoll_event *)local_40);
  if (this_local._4_4_ == 0) {
    iobject::set_events(object,event.data.u64._4_4_);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int fepoll::del_event(iobject* object, socket_t fd, int events)
{
    int exists = object->get_events();
    int newevs = exists & (~events);
    int op = (newevs == 0) ? EPOLL_CTL_DEL : EPOLL_CTL_MOD;

    epoll_event event;
    event.data.ptr = object;
    event.events = newevs;
    int ret = epoll_ctl(epfd_, op, fd, &event);
    if (ret != 0) {
        return ret;
    }

    object->set_events(newevs);
    return 0;
}